

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

size_type __thiscall
phmap::priv::
btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>::
internal_verify(btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                *this,node_type *node,key_type *lo,key_type *hi)

{
  long *plVar1;
  node_type *node_00;
  field_type fVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  template_ElementType<2UL> *ptVar6;
  template_ElementType<2UL> *ptVar7;
  template_ElementType<3UL> *ppbVar8;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
  *pbVar9;
  size_type sVar10;
  key_type *hi_00;
  long lVar11;
  int i;
  ulong uVar12;
  size_type sVar13;
  key_type *lo_00;
  
  fVar2 = btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
          ::count(node);
  if (fVar2 == '\0') {
    __assert_fail("node->count() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xca3,
                  "typename btree<P>::size_type phmap::priv::btree<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>]"
                 );
  }
  bVar3 = btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
          ::count(node);
  bVar4 = btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
          ::max_count(node);
  if (bVar4 < bVar3) {
    __assert_fail("node->count() <= node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xca4,
                  "typename btree<P>::size_type phmap::priv::btree<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>]"
                 );
  }
  if (lo != (key_type *)0x0) {
    ptVar6 = btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
             ::GetField<2ul>((btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                              *)node);
    if (*ptVar6 < *lo) {
      __assert_fail("!compare_keys(node->key(0), *lo)",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xca6,
                    "typename btree<P>::size_type phmap::priv::btree<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>]"
                   );
    }
  }
  if (hi != (key_type *)0x0) {
    bVar3 = btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
            ::count(node);
    ptVar6 = btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
             ::GetField<2ul>((btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                              *)node);
    if (*hi < ptVar6[(ulong)bVar3 - 1]) {
      __assert_fail("!compare_keys(*hi, node->key(node->count() - 1))",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xca9,
                    "typename btree<P>::size_type phmap::priv::btree<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>]"
                   );
    }
  }
  uVar12 = 1;
  while( true ) {
    bVar3 = btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
            ::count(node);
    if (bVar3 <= uVar12) break;
    ptVar6 = btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
             ::GetField<2ul>((btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                              *)node);
    ptVar7 = btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
             ::GetField<2ul>((btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                              *)node);
    plVar1 = ptVar6 + uVar12;
    lVar11 = uVar12 - 1;
    uVar12 = uVar12 + 1;
    if (*plVar1 < ptVar7[lVar11]) {
      __assert_fail("!compare_keys(node->key(i), node->key(i - 1))",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xcac,
                    "typename btree<P>::size_type phmap::priv::btree<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>]"
                   );
    }
  }
  bVar3 = btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
          ::count(node);
  sVar13 = (size_type)bVar3;
  bVar5 = btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
          ::leaf(node);
  if (!bVar5) {
    lVar11 = 0;
    uVar12 = 0;
    while( true ) {
      bVar3 = btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
              ::count(node);
      if (bVar3 < uVar12) break;
      ppbVar8 = btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                ::GetField<3ul>((btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                                 *)node);
      if (*(long *)((long)ppbVar8 + lVar11) == 0) {
        __assert_fail("node->child(i) != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xcb1,
                      "typename btree<P>::size_type phmap::priv::btree<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>]"
                     );
      }
      ppbVar8 = btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                ::GetField<3ul>((btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                                 *)node);
      pbVar9 = btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
               ::parent(*(btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                          **)((long)ppbVar8 + lVar11));
      if (pbVar9 != node) {
        __assert_fail("node->child(i)->parent() == node",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xcb2,
                      "typename btree<P>::size_type phmap::priv::btree<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>]"
                     );
      }
      ppbVar8 = btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                ::GetField<3ul>((btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                                 *)node);
      bVar3 = btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
              ::position(*(btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                           **)((long)ppbVar8 + lVar11));
      if (uVar12 != bVar3) {
        __assert_fail("node->child(i)->position() == i",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xcb3,
                      "typename btree<P>::size_type phmap::priv::btree<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>]"
                     );
      }
      ppbVar8 = btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                ::GetField<3ul>((btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                                 *)node);
      node_00 = *(node_type **)((long)ppbVar8 + lVar11);
      lo_00 = lo;
      if (lVar11 != 0) {
        ptVar6 = btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                 ::GetField<2ul>((btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                                  *)node);
        lo_00 = (key_type *)((long)ptVar6 + lVar11 + -8);
      }
      bVar3 = btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
              ::count(node);
      hi_00 = hi;
      if (uVar12 != bVar3) {
        ptVar6 = btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                 ::GetField<2ul>((btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                                  *)node);
        hi_00 = (key_type *)((long)ptVar6 + lVar11);
      }
      sVar10 = internal_verify(this,node_00,lo_00,hi_00);
      sVar13 = sVar13 + sVar10;
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 8;
    }
  }
  return sVar13;
}

Assistant:

typename btree<P>::size_type btree<P>::internal_verify(
        const node_type *node, const key_type *lo, const key_type *hi) const {
        assert(node->count() > 0);
        assert(node->count() <= node->max_count());
        if (lo) {
            assert(!compare_keys(node->key(0), *lo));
        }
        if (hi) {
            assert(!compare_keys(*hi, node->key(node->count() - 1)));
        }
        for (int i = 1; i < node->count(); ++i) {
            assert(!compare_keys(node->key(i), node->key(i - 1)));
        }
        size_type count = node->count();
        if (!node->leaf()) {
            for (int i = 0; i <= node->count(); ++i) {
                assert(node->child(i) != nullptr);
                assert(node->child(i)->parent() == node);
                assert(node->child(i)->position() == i);
                count += internal_verify(
                    node->child(i),
                    (i == 0) ? lo : &node->key(i - 1),
                    (i == node->count()) ? hi : &node->key(i));
            }
        }
        return count;
    }